

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  FILE *__stream;
  float_type fVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  long val;
  _Bool verbose;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  float_type extraout_XMM0_Qa;
  float_type extraout_XMM0_Qa_00;
  float_type extraout_XMM0_Qa_01;
  float_type extraout_XMM0_Qa_02;
  float_type extraout_XMM0_Qa_03;
  float_type extraout_XMM0_Qa_04;
  float_type extraout_XMM0_Qa_05;
  float_type extraout_XMM0_Qa_06;
  float_type extraout_XMM0_Qa_07;
  float_type extraout_XMM0_Qa_08;
  float_type fVar8;
  double dVar9;
  double dVar10;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  float_type Sc;
  uint setup_id;
  uint border_cpml_width;
  float_type end_time;
  float_type smallest_wavelength;
  size_t num_iterations;
  float_type domain_size [3];
  time_measure startTime;
  time_measure endTime;
  fdtd fdtd;
  int local_298;
  double local_290;
  undefined4 local_284;
  uint local_280;
  uint local_27c;
  char *local_278;
  double local_270;
  double local_268;
  undefined8 local_260;
  float_type local_258;
  double dStack_250;
  double local_248 [2];
  timespec local_238;
  timespec local_228;
  undefined1 local_218 [8];
  fdtd3D local_210;
  
  local_258 = 1e-05;
  dStack_250 = 1e-05;
  local_248[0] = 1e-05;
  local_290 = -1.0;
  local_268 = 4.5e-07;
  local_27c = 0x14;
  local_280 = 0;
  local_270 = -1.0;
  local_260 = 400;
  local_284 = (undefined4)CONCAT71((int7)((ulong)&local_260 >> 8),1);
  local_298 = 1;
  local_278 = (char *)0x0;
  do {
    uVar3 = getopt_long(argc,argv,":123s:x:y:z:o:c:w:a:t:i:hq",opt_options,0);
    uVar5 = (ulong)uVar3;
    fVar8 = extraout_XMM0_Qa;
    if ((int)uVar3 < 0x33) {
      if (uVar3 == 0xffffffff) {
        iVar7 = 3;
      }
      else if (uVar3 == 0x31) {
        iVar7 = 0;
        local_298 = 1;
      }
      else {
        if (uVar3 != 0x32) goto switchD_00102486_caseD_62;
        iVar7 = 0;
        local_298 = 2;
      }
    }
    else {
      switch(uVar3) {
      case 0x61:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%u",&local_27c);
        fVar8 = extraout_XMM0_Qa_00;
        if (iVar4 + 1U < 2) {
          iVar7 = 0;
          fprintf(_stderr,
                  "Please enter a positive integer for the cpml thickness instead of \"-%c %s\"\n",
                  uVar5,_optarg);
          local_27c = 0x14;
        }
        break;
      case 99:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_290);
        fVar2 = extraout_XMM0_Qa_07;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= local_290) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        local_290 = -1.0;
        break;
      case 0x68:
        printf("Usage: %s <options>\n%s\n",*argv,
               "Options:\n  -1 --one-dimensional     : 1D solver\n  -2 --one-dimensional     : 2D solver\n  -3 --one-dimensional     : 3D solver\n  -s --setup-id            : Predefined problem identifier\n                             1D : 0 - Half air half water, left-to-right gaussian\n                             2D : 0 - West air east water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object, west pulse\n                                  2 - Centered gaussian excitation in free space\n                             3D : 0 - Half air half water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object\n  -x --size-x              : Size of the domain (e.g. 0.00001)\n  -y --size-y              : Size of the domain (e.g. 0.00001)\n  -z --size-z              : Size of the domain (e.g. 0.00001)\n  -o --output              : Select the output file name\n  -c --courant-friedrichs-levy-condition : Stability value\n  -w --smallest-wavelength : Smallest wavelength in the simulation\n  -a --cpml-absorbing-thickness  : Size of the absorbing boundary wall\n  -t --stop-sim-time       : Stop the simulation when the time is reached\n  -i --num-iterations      : Stop the simulation after the specified amount of solver iterations\n  -h --help                : Print this help\n  -q --quiet               : Do not print information to the user from inside the main kernel"
              );
        iVar7 = 1;
        break;
      case 0x69:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%zu",&local_260);
        fVar8 = extraout_XMM0_Qa_02;
        if (iVar4 + 1U < 2) {
          iVar7 = 0;
          fprintf(_stderr,
                  "Please enter a positive integer for the number of iterations instead of \"-%c %s\"\n"
                  ,uVar5,_optarg);
          local_260 = 0;
        }
        break;
      case 0x6f:
        iVar7 = 0;
        if (_optarg != (char *)0x0) {
          local_278 = _optarg;
          if ((*_optarg != '-') && (*_optarg != '\0')) break;
          if (_optarg != (char *)0x0) {
            _optind = _optind + -1;
          }
        }
        local_278 = "gridData.dat";
        break;
      case 0x71:
        local_284 = 0;
      case 0x62:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x72:
      case 0x75:
      case 0x76:
switchD_00102486_caseD_62:
        iVar7 = 0;
        break;
      case 0x73:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%u",&local_280);
        fVar8 = extraout_XMM0_Qa_05;
        if (iVar4 + 1U < 2) {
          iVar7 = 0;
          fprintf(_stderr,"Please enter a positive integer for the setup id instead of \"-%c %s\"\n"
                  ,uVar5,_optarg);
          local_280 = 0;
        }
        break;
      case 0x74:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_270);
        fVar2 = extraout_XMM0_Qa_01;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= local_270) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the simulation end time instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        local_270 = -1.0;
        break;
      case 0x77:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_268);
        fVar2 = extraout_XMM0_Qa_04;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= local_268) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        local_268 = 4.5e-07;
        break;
      case 0x78:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&local_258);
        fVar2 = extraout_XMM0_Qa_08;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= local_258) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        local_258 = 1e-05;
        break;
      case 0x79:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",&dStack_250);
        fVar2 = extraout_XMM0_Qa_03;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= dStack_250) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        dStack_250 = 1e-05;
        break;
      case 0x7a:
        iVar7 = 0;
        iVar4 = __isoc99_sscanf(_optarg,"%lf",local_248);
        fVar2 = extraout_XMM0_Qa_06;
        if (1 < iVar4 + 1U) {
          fVar8 = 0.0;
          fVar2 = 0.0;
          if (0.0 <= local_248[0]) break;
        }
        fVar8 = fVar2;
        iVar7 = 0;
        fprintf(_stderr,
                "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
                ,uVar5,_optarg);
        local_248[0] = 1e-05;
        break;
      default:
        if (uVar3 != 0x33) goto switchD_00102486_caseD_62;
        iVar7 = 0;
        local_298 = 3;
      }
    }
  } while (iVar7 == 0);
  if (iVar7 != 3) {
    return 0;
  }
  uVar5 = (ulong)local_280;
  if (local_298 == 3) {
    if (local_280 < 2) {
      uVar5 = (ulong)(local_280 | 6);
      if ((local_290 == -1.0) && (!NAN(local_290))) {
        local_290 = 0.5;
      }
      goto LAB_001029c6;
    }
  }
  else {
    if (local_298 == 2) {
      if (local_280 < 3) {
        uVar5 = (ulong)(local_280 + 2);
        if ((local_290 == -1.0) && (!NAN(local_290))) {
          local_290 = 0.5773502691896258;
        }
        goto LAB_001029c6;
      }
    }
    else {
      if (local_280 != 0) goto LAB_00102bc9;
      uVar5 = 0;
      if ((local_290 == -1.0) && (uVar5 = 0, !NAN(local_290))) {
        local_290 = 1.0;
        uVar5 = 0;
      }
LAB_001029c6:
      initializeFdtd_cmpl((fdtd *)local_218,(uint)uVar5,&local_258,local_290,local_268,
                          (ulong)local_27c);
      fVar8 = 0.0;
      dVar9 = local_270;
      if (0.0 < local_270) {
LAB_00102a1a:
        clock_gettime(4,&local_238);
        if (local_218._0_4_ == fdtd_three_dims) {
          run_3D_fdtd((fdtd3D *)(local_218 + 8),dVar9,(_Bool)((byte)local_284 & 1));
        }
        else if (local_218._0_4_ == fdtd_two_dims) {
          run_2D_fdtd((fdtd2D *)(local_218 + 8),dVar9,(_Bool)((byte)local_284 & 1));
        }
        else if (local_218._0_4_ == fdtd_one_dim) {
          run_1D_fdtd((fdtd1D *)(local_218 + 8),dVar9,(_Bool)((byte)local_284 & 1));
        }
        clock_gettime(4,&local_228);
        __stream = _stdout;
        if (local_228.tv_nsec < local_238.tv_nsec) {
          dVar9 = (double)((local_228.tv_nsec - local_238.tv_nsec) + 1000000000) / 1000000000.0 +
                  -1.0;
        }
        else {
          dVar9 = (double)(local_228.tv_nsec - local_238.tv_nsec) / 1000000000.0;
        }
        dVar10 = difftime(local_228.tv_sec,local_238.tv_sec);
        fprintf(__stream,"Kernel time %.4fs\n",dVar10 + dVar9);
        if (local_278 != (char *)0x0) {
          if (local_218._0_4_ == fdtd_three_dims) {
            dump_3D_fdtd((fdtd3D *)(local_218 + 8),local_278,dump_ez);
          }
          else if (local_218._0_4_ == fdtd_two_dims) {
            dump_2D_fdtd((fdtd2D *)(local_218 + 8),local_278,dump_ez);
          }
          else if (local_218._0_4_ == fdtd_one_dim) {
            dump_1D_fdtd((fdtd1D *)(local_218 + 8),local_278,dump_ez);
          }
        }
        if (local_218._0_4_ == fdtd_three_dims) {
          free_3D_fdtd((fdtd3D *)(local_218 + 8));
        }
        else if (local_218._0_4_ == fdtd_two_dims) {
          free_2D_fdtd((fdtd2D *)(local_218 + 8));
        }
        else if (local_218._0_4_ == fdtd_one_dim) {
          free_1D_fdtd((fdtd1D *)(local_218 + 8));
        }
        return 0;
      }
      if ((ulong)(uint)local_218._0_4_ < 3) {
        auVar1._8_8_ = in_XMM2_Qb;
        auVar1._0_8_ = in_XMM2_Qa;
        auVar1 = vcvtusi2sd_avx512f(auVar1,local_260);
        dVar9 = auVar1._0_8_ * (double)local_210.psi_hx_y[(ulong)(uint)local_218._0_4_ - 0xb];
        goto LAB_00102a1a;
      }
      main_cold_4();
    }
    main_cold_2();
  }
  main_cold_1();
LAB_00102bc9:
  piVar6 = (int *)(uVar5 & 0xffffffff);
  main_cold_3();
  iVar7 = *piVar6;
  verbose = SUB81(uVar5,0);
  if (iVar7 == 2) {
    run_3D_fdtd((fdtd3D *)(piVar6 + 2),fVar8,verbose);
    return extraout_EAX_01;
  }
  if (iVar7 != 1) {
    if (iVar7 == 0) {
      run_1D_fdtd((fdtd1D *)(piVar6 + 2),fVar8,verbose);
      return extraout_EAX;
    }
    return iVar7;
  }
  run_2D_fdtd((fdtd2D *)(piVar6 + 2),fVar8,verbose);
  return extraout_EAX_00;
}

Assistant:

int main(int argc, char **argv) {
  float_type domain_size[3] = {default_domain_size, default_domain_size,
                               default_domain_size};
  char *output_filename = NULL;
  float_type Sc = default_Sc;
  float_type smallest_wavelength = default_smallest_wavelength;
  unsigned border_cpml_width = default_cpml_width;
  unsigned dimension = 1;
  unsigned setup_id = 0; // Default to the first one for each the dimension
  float_type end_time = default_end_time;
  size_t num_iterations = default_iteration_count;
  bool verbose = true;

  while (true) {
    int sscanf_return;
    int optchar = getopt_long(argc, argv, options, opt_options, NULL);
    if (optchar == -1)
      break;
    switch (optchar) {
    case '1':
      dimension = 1;
      break;
    case '2':
      dimension = 2;
      break;
    case '3':
      dimension = 3;
      break;
    case 'o':
      if (optarg != NULL && optarg[0] != '-' && optarg[0] != '\0') {
        output_filename = optarg;
      } else {
        output_filename = "gridData.dat";
        if (optarg != NULL)
          optind--;
      }
      break;
    case 'q':
      verbose = false;
      break;
    case 'x':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[0]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[0]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[0] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[0] = default_domain_size;
      }
      break;
    case 'y':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[1]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[1]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[1] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[1] = default_domain_size;
      }
      break;
    case 'z':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[2]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[2]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[2] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[2] = default_domain_size;
      }
      break;
    case 'a':
      sscanf_return = sscanf(optarg, "%u", &border_cpml_width);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the cpml thickness "
                "instead of \"-%c %s\"\n",
                optchar, optarg);
        border_cpml_width = default_cpml_width;
      }
      break;
    case 's':
      sscanf_return = sscanf(optarg, "%u", &setup_id);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the setup id instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        setup_id = 0;
      }
      break;
    case 'i':
      sscanf_return = sscanf(optarg, "%zu", &num_iterations);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the number of iterations "
                "instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        num_iterations = 0;
      }
      break;
    case 'c':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &Sc);
#else
      sscanf_return = sscanf(optarg, "%f", &Sc);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 || Sc < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        Sc = default_Sc;
      }
      break;
    case 't':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &end_time);
#else
      sscanf_return = sscanf(optarg, "%f", &end_time);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          end_time < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the "
                "simulation end time instead of \"-%c %s\"\n",
                optchar, optarg);
        end_time = default_end_time;
      }
      break;
    case 'w':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &smallest_wavelength);
#else
      sscanf_return = sscanf(optarg, "%f", &smallest_wavelength);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          smallest_wavelength < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        smallest_wavelength = default_smallest_wavelength;
      }
      break;
    case 'h':
      printf("Usage: %s <options>\n%s\n", argv[0], help_string);
      return EXIT_SUCCESS;
    }
  }

  unsigned initialize_setup_id;
  switch (dimension) {
  case 1: {
    if (setup_id >= last_1D_setup) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 1D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id;
    if (Sc == default_Sc) {
      Sc = float_cst(1.);
    }
  } break;
  case 2: {
    if (setup_id >= last_2D_setup - last_1D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 2D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_1D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(3.));
    }
  } break;
  case 3: {
    if (setup_id >= last_3D_setup - last_2D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 3D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_2D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(4.));
    }
  } break;
  }

  struct fdtd fdtd =
      initializeFdtd_cmpl(initialize_setup_id, domain_size, Sc,
                          smallest_wavelength, border_cpml_width);

  float_type stop_time;
  if (end_time > float_cst(0.)) {
    stop_time = end_time;
  } else {
    stop_time = (float_type)num_iterations * get_time_step_fdtd(&fdtd);
  }
  time_measure startTime, endTime;
  get_current_time(&startTime);
  run_fdtd(&fdtd, stop_time, verbose);
  get_current_time(&endTime);
  fprintf(stdout, "Kernel time %.4fs\n",
          measuring_difftime(startTime, endTime));
  if (output_filename) {
    dump_fdtd(&fdtd, output_filename, dump_ez);
  }
  free_fdtd(&fdtd);

  return EXIT_SUCCESS;
}